

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaOutputFile::ToYca::writePixels(ToYca *this,int numScanLines)

{
  Rgba **__dest;
  Rgba **__src;
  Rgba *pRVar1;
  int i;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  ArgExc *this_00;
  long lVar6;
  int iVar7;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pRVar1 = this->_fbBase;
  if (pRVar1 == (Rgba *)0x0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"No frame buffer was specified as the pixel data source for image file \"",
               0x47);
    pcVar4 = OutputFile::fileName(this->_outputFile);
    poVar5 = std::operator<<(local_1a8,pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1b8);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if ((this->_writeY == true) && (this->_writeC == false)) {
    if (0 < numScanLines) {
      iVar3 = 0;
      do {
        iVar7 = this->_width;
        if (0 < iVar7) {
          lVar6 = 0;
          do {
            this->_tmpBuf[lVar6] =
                 pRVar1[(this->_xMin + lVar6) * this->_fbXStride +
                        (long)this->_currentScanLine * this->_fbYStride];
            lVar6 = lVar6 + 1;
            iVar7 = this->_width;
          } while (lVar6 < iVar7);
        }
        RgbaYca::RGBAtoYCA(&this->_yw,iVar7,this->_writeA,this->_tmpBuf,this->_tmpBuf);
        OutputFile::writePixels(this->_outputFile,1);
        this->_linesConverted = this->_linesConverted + 1;
        this->_currentScanLine =
             this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
        iVar3 = iVar3 + 1;
      } while (iVar3 != numScanLines);
    }
  }
  else if (0 < numScanLines) {
    __dest = this->_buf;
    __src = this->_buf + 1;
    iVar3 = 0;
    do {
      iVar7 = this->_width;
      if (0 < iVar7) {
        pRVar1 = this->_fbBase;
        lVar6 = 0;
        do {
          this->_tmpBuf[lVar6 + 0xd] =
               pRVar1[(this->_xMin + lVar6) * this->_fbXStride +
                      (long)this->_currentScanLine * this->_fbYStride];
          lVar6 = lVar6 + 1;
          iVar7 = this->_width;
        } while (lVar6 < iVar7);
      }
      RgbaYca::RGBAtoYCA(&this->_yw,iVar7,this->_writeA,this->_tmpBuf + 0xd,this->_tmpBuf + 0xd);
      lVar6 = 0;
      do {
        this->_tmpBuf[lVar6] = this->_tmpBuf[0xd];
        this->_tmpBuf[(int)lVar6 + 0xd + this->_width] = this->_tmpBuf[(long)this->_width + 0xb];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xd);
      pRVar1 = this->_buf[0];
      memmove(__dest,__src,0xd0);
      this->_buf[0x1a] = pRVar1;
      RgbaYca::decimateChromaHoriz(this->_width,this->_tmpBuf,pRVar1);
      if (this->_linesConverted == 0) {
        iVar7 = 0xd;
        do {
          pRVar1 = this->_buf[0];
          memmove(__dest,__src,0xd0);
          this->_buf[0x1a] = pRVar1;
          memcpy(pRVar1,this->_buf[0x19],(long)this->_width << 3);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      iVar7 = this->_linesConverted;
      this->_linesConverted = iVar7 + 1;
      if (0xc < iVar7) {
        decimateChromaVertAndWriteScanLine(this);
      }
      if (this->_height <= this->_linesConverted) {
        if (this->_height < 0xd) {
          iVar7 = 0;
          do {
            pRVar1 = this->_buf[0];
            memmove(__dest,__src,0xd0);
            this->_buf[0x1a] = pRVar1;
            memcpy(pRVar1,this->_buf[0x19],(long)this->_width << 3);
            iVar7 = iVar7 + 1;
          } while (iVar7 < 0xd - this->_height);
        }
        pRVar1 = this->_buf[0];
        memmove(__dest,__src,0xd0);
        this->_buf[0x1a] = pRVar1;
        memcpy(pRVar1,this->_buf[0x18],(long)this->_width << 3);
        this->_linesConverted = this->_linesConverted + 1;
        decimateChromaVertAndWriteScanLine(this);
        if (1 < this->_height) {
          iVar7 = 1;
          do {
            pRVar1 = this->_buf[0];
            memmove(__dest,__src,0xd0);
            this->_buf[0x1a] = pRVar1;
            memcpy(pRVar1,this->_buf[0x19],(long)this->_width << 3);
            this->_linesConverted = this->_linesConverted + 1;
            decimateChromaVertAndWriteScanLine(this);
            iVar7 = iVar7 + 1;
            iVar2 = this->_height;
            if (0xc < iVar2) {
              iVar2 = 0xd;
            }
          } while (iVar7 < iVar2);
        }
      }
      this->_currentScanLine =
           this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
      iVar3 = iVar3 + 1;
    } while (iVar3 != numScanLines);
  }
  return;
}

Assistant:

void
RgbaOutputFile::ToYca::writePixels (int numScanLines)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data source for image file "
            "\"" << _outputFile.fileName ()
                 << "\".");
    }

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    if (_writeY && !_writeC)
    {
        //
        // We are writing only luminance; filtering
        // and subsampling are not necessary.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            for (int j = 0; j < _width; ++j)
            {
                _tmpBuf[j] = *reinterpret_cast<Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
            }

            //
            // Convert the scan line from RGB to luminance/chroma,
            // and store the result in the output file.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf, _tmpBuf);
            _outputFile.writePixels (1);

            ++_linesConverted;

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
    else
    {
        //
        // We are writing chroma; the pixels must be filtered and subsampled.
        //

        for (int i = 0; i < numScanLines; ++i)
        {
            //
            // Copy the next scan line from the caller's
            // frame buffer into _tmpBuf.
            //

            intptr_t base = reinterpret_cast<intptr_t> (_fbBase);

            for (int j = 0; j < _width; ++j)
            {
                const Rgba* ptr = reinterpret_cast<const Rgba*> (
                    base + sizeof (Rgba) * (_fbYStride * _currentScanLine +
                                            _fbXStride * (j + _xMin)));
                _tmpBuf[j + N2] = *ptr;
            }

            //
            // Convert the scan line from RGB to luminance/chroma.
            //

            RGBAtoYCA (_yw, _width, _writeA, _tmpBuf + N2, _tmpBuf + N2);

            //
            // Append N2 copies of the first and last pixel to the
            // beginning and end of the scan line.
            //

            padTmpBuf ();

            //
            // Filter and subsample the scan line's chroma channels
            // horizontally; store the result in _buf.
            //

            rotateBuffers ();
            decimateChromaHoriz (_width, _tmpBuf, _buf[N - 1]);

            //
            // If this is the first scan line in the image,
            // store N2 more copies of the scan line in _buf.
            //

            if (_linesConverted == 0)
            {
                for (int j = 0; j < N2; ++j)
                    duplicateLastBuffer ();
            }

            ++_linesConverted;

            //
            // If we have have converted at least N2 scan lines from
            // RGBA to luminance/chroma, then we can start to filter
            // and subsample vertically, and store pixels in the
            // output file.
            //

            if (_linesConverted > N2) decimateChromaVertAndWriteScanLine ();

            //
            // If we have already converted the last scan line in
            // the image to luminance/chroma, filter, subsample and
            // store the remaining scan lines in _buf.
            //

            if (_linesConverted >= _height)
            {
                for (int j = 0; j < N2 - _height; ++j)
                    duplicateLastBuffer ();

                duplicateSecondToLastBuffer ();
                ++_linesConverted;
                decimateChromaVertAndWriteScanLine ();

                for (int j = 1; j < min (_height, N2); ++j)
                {
                    duplicateLastBuffer ();
                    ++_linesConverted;
                    decimateChromaVertAndWriteScanLine ();
                }
            }

            if (_lineOrder == INCREASING_Y)
                ++_currentScanLine;
            else
                --_currentScanLine;
        }
    }
}